

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# span.hpp
# Opt level: O2

span<int,_18446744073709551615UL> __thiscall
nonstd::span_lite::span<int,_18446744073709551615UL>::first
          (span<int,_18446744073709551615UL> *this,size_type count)

{
  span<int,_18446744073709551615UL> local_20;
  
  if (this->size_ < count) {
    detail::report_contract_violation
              (
              "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]span-lite/include/nonstd/span.hpp:1190: Precondition violation."
              );
  }
  span<int_*,_0>(&local_20,this->data_,count);
  return local_20;
}

Assistant:

span_constexpr_exp span< element_type, dynamic_extent >
    first( size_type count ) const
    {
        span_EXPECTS( detail::is_positive( count ) && count <= size() );

        return span< element_type, dynamic_extent >( data(), count );
    }